

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestTest.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_29931::TestThrowingTestsAreReportedAsFailures::RunImpl
          (TestThrowingTestsAreReportedAsFailures *this)

{
  TestResults *results_00;
  TestResults **ppTVar1;
  TestDetails **ppTVar2;
  int local_6c;
  ScopedCurrentTest scopedResult;
  Test local_58;
  TestResults results;
  
  UnitTest::TestResults::TestResults(&results,(TestReporter *)0x0);
  ScopedCurrentTest::ScopedCurrentTest(&scopedResult,&results,(TestDetails *)0x0);
  UnitTest::Test::Test(&local_58,"throwing","DefaultSuite","",0);
  local_58._vptr_Test = (_func_int **)&PTR__Test_00151550;
  UnitTest::Test::Run(&local_58);
  UnitTest::Test::~Test(&local_58);
  ScopedCurrentTest::~ScopedCurrentTest(&scopedResult);
  ppTVar1 = UnitTest::CurrentTest::Results();
  results_00 = *ppTVar1;
  scopedResult.m_oldTestResults._0_4_ = 1;
  local_6c = UnitTest::TestResults::GetFailureCount(&results);
  ppTVar2 = UnitTest::CurrentTest::Details();
  UnitTest::TestDetails::TestDetails((TestDetails *)&local_58,*ppTVar2,0x48);
  UnitTest::CheckEqual<int,int>(results_00,(int *)&scopedResult,&local_6c,(TestDetails *)&local_58);
  return;
}

Assistant:

TEST(ThrowingTestsAreReportedAsFailures)
{
    class CrashingTest : public Test
    {
    public:
        CrashingTest() : Test("throwing") {}
        virtual void RunImpl() const
        {
            throw "Blah";
        }
    };
 
    TestResults results;
	{
		ScopedCurrentTest scopedResult(results);
		CrashingTest().Run();
	}

	CHECK_EQUAL(1, results.GetFailureCount());
}